

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O0

int lws_context_init_ssl_library(lws_context_creation_info *info)

{
  lws_context_creation_info *info_local;
  
  _lws_log(8," Compiled with OpenSSL support\n");
  if ((info->options & 0x1000) == 0x1000) {
    _lws_log(8,"Doing SSL library init\n");
    OPENSSL_init_ssl(0x200000,0);
    openssl_websocket_private_data_index =
         CRYPTO_get_ex_new_index(0,0,"lws",(undefined1 *)0x0,(undefined1 *)0x0,(undefined1 *)0x0);
    openssl_SSL_CTX_private_data_index =
         CRYPTO_get_ex_new_index
                   (1,0,(void *)0x0,(undefined1 *)0x0,(undefined1 *)0x0,(undefined1 *)0x0);
  }
  else {
    _lws_log(8," SSL disabled: no LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT\n");
  }
  return 0;
}

Assistant:

int
lws_context_init_ssl_library(const struct lws_context_creation_info *info)
{
#ifdef USE_WOLFSSL
#ifdef USE_OLD_CYASSL
	lwsl_info(" Compiled with CyaSSL support\n");
#else
	lwsl_info(" Compiled with wolfSSL support\n");
#endif
#else
#if defined(LWS_WITH_BORINGSSL)
	lwsl_info(" Compiled with BoringSSL support\n");
#else
	lwsl_info(" Compiled with OpenSSL support\n");
#endif
#endif
	if (!lws_check_opt(info->options, LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT)) {
		lwsl_info(" SSL disabled: no "
			  "LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT\n");
		return 0;
	}

	/* basic openssl init */

	lwsl_info("Doing SSL library init\n");

#if OPENSSL_VERSION_NUMBER < 0x10100000L
	SSL_library_init();
	OpenSSL_add_all_algorithms();
	SSL_load_error_strings();
#else
	OPENSSL_init_ssl(OPENSSL_INIT_LOAD_SSL_STRINGS, NULL);
#endif
#if defined(LWS_WITH_NETWORK)
	openssl_websocket_private_data_index =
		SSL_get_ex_new_index(0, "lws", NULL, NULL, NULL);

	openssl_SSL_CTX_private_data_index = SSL_CTX_get_ex_new_index(0,
			NULL, NULL, NULL, NULL);
#endif

#if LWS_MAX_SMP != 1
	{
		int n;

		openssl_mutexes = (pthread_mutex_t *)
				OPENSSL_malloc(CRYPTO_num_locks() *
					       sizeof(openssl_mutexes[0]));

		for (n = 0; n < CRYPTO_num_locks(); n++)
			pthread_mutex_init(&openssl_mutexes[n], NULL);

		/*
		 * These "functions" disappeared in later OpenSSL which is
		 * already threadsafe.
		 */

		(void)lws_openssl_thread_id;
		(void)lws_openssl_lock_callback;

		CRYPTO_set_id_callback(lws_openssl_thread_id);
		CRYPTO_set_locking_callback(lws_openssl_lock_callback);
	}
#endif

	return 0;
}